

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O1

errr CheckEvent(_Bool wait)

{
  term *t;
  uint uVar1;
  uint uVar2;
  bool bVar3;
  wchar_t wVar4;
  int iVar5;
  int iVar6;
  wchar_t wVar7;
  long lVar8;
  wchar_t wVar9;
  keycode_t k;
  undefined7 in_register_00000039;
  byte bVar10;
  byte bVar11;
  wchar_t h;
  infowin *piVar12;
  term *t_00;
  wchar_t w;
  bool bVar13;
  KeySym ks;
  XEvent xev_body;
  ulong local_180;
  int local_178 [8];
  Window local_158;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  short local_140;
  short local_13c;
  int local_138;
  int local_134;
  uint local_128;
  int local_124;
  char local_b8 [136];
  
  t = (term *)Term->data;
  if (((int)CONCAT71(in_register_00000039,wait) == 0) &&
     (iVar5 = XPending(metadpy_default_0), iVar5 == 0)) {
    return 1;
  }
  iVar5 = XPending(metadpy_default_0);
  if (iVar5 == 0) {
    iVar5 = 0;
    do {
      if (iVar5 == 0) {
        idle_update();
      }
      usleep(20000);
      iVar5 = (iVar5 + 1) % 10;
      iVar6 = XPending(metadpy_default_0);
    } while (iVar6 == 0);
  }
  XNextEvent(metadpy_default_0);
  if (local_178[0] == 0x22) {
    XRefreshKeyboardMapping(local_178);
    return 0;
  }
  lVar8 = 0;
  do {
    piVar12 = *(infowin **)((long)&data[0].win + lVar8);
    if (local_158 == piVar12->win) {
      bVar13 = lVar8 == 0;
      t_00 = (term *)((long)&data[0].t.user + lVar8);
      goto LAB_00125845;
    }
    lVar8 = lVar8 + 0x108;
  } while (lVar8 != 0x840);
  bVar13 = true;
  piVar12 = (infowin *)0x0;
  t_00 = (term *)0x0;
LAB_00125845:
  if (piVar12 == (infowin *)0x0 || t_00 == (term *)0x0) {
    return 0;
  }
  Term_activate(t_00);
  Infowin = piVar12;
  if (0x11 < local_178[0]) {
    if (local_178[0] == 0x12) {
      piVar12->field_0x23 = piVar12->field_0x23 & 0xfe;
      Term->mapped_flag = false;
    }
    else if (local_178[0] == 0x13) {
      piVar12->field_0x23 = piVar12->field_0x23 | 1;
      Term->mapped_flag = true;
    }
    else if (local_178[0] == 0x16) {
      piVar12->x = (int16_t)local_148;
      piVar12->y = (int16_t)local_144;
      piVar12->w = local_140;
      piVar12->h = local_13c;
      wVar9 = ((int)local_140 + piVar12->ox * -2) / *(int *)&t_00[1].user_flag;
      wVar7 = ((int)local_13c + piVar12->oy * -2) / *(int *)&t_00[1].always_pict;
      w = L'\x01';
      if (L'\x01' < wVar9) {
        w = wVar9;
      }
      h = L'\x01';
      if (L'\x01' < wVar7) {
        h = wVar7;
      }
      if (bVar13) {
        wVar4 = L'P';
        if (L'O' < wVar9) {
          wVar4 = w;
        }
        w = wVar4;
        wVar4 = L'\x18';
        if ((wVar7 < L'\x18') || (wVar4 = h, wVar9 < L'P')) {
          h = wVar4;
          Infowin = (infowin *)t_00[1].data;
          XResizeWindow(metadpy_default_0,Infowin->win,
                        *(int *)&t_00[1].user_flag * w + piVar12->ox * 2,
                        *(int *)&t_00[1].always_pict * h + piVar12->oy * 2);
        }
      }
      Term_resize(w,h);
    }
    goto LAB_00125b5a;
  }
  if (local_178[0] != 2) {
    if (local_178[0] == 4) {
      iVar5 = 0;
      if (local_124 - 1U < 5) {
        iVar5 = local_124;
      }
      Term_mousepress((local_138 - piVar12->ox) / *(int *)((long)Term->data + 0xe8),
                      (local_134 - piVar12->oy) / *(int *)((long)Term->data + 0xf0),
                      ((byte)((local_128 & 1) << 5) | (byte)iVar5) + ((byte)local_128 & 4) * '\x04'
                      + ((byte)local_128 & 8) * '\b');
    }
    else if (local_178[0] == 0xc) {
      local_150 = local_150 - piVar12->ox;
      local_14c = local_14c - piVar12->oy;
      Term_redraw_section(local_150 / *(int *)&t_00[1].user_flag,
                          local_14c / *(int *)&t_00[1].always_pict,
                          (local_150 + local_148) / *(int *)&t_00[1].user_flag,
                          (local_14c + local_144) / *(int *)&t_00[1].always_pict);
    }
    goto LAB_00125b5a;
  }
  Term_activate(t);
  uVar1 = metadpy_default_4 & local_128;
  uVar2 = metadpy_default_5 & local_128;
  iVar5 = XLookupString(local_178,local_b8,0x7d,&local_180,0);
  local_b8[iVar5] = '\0';
  if ((local_180 - 0xffe1 < 0xe) ||
     ((local_180 & 0xfffffffffffffffe) == 0xff7e || local_180 - 0xfe01 < 0x13)) goto LAB_00125b5a;
  bVar11 = (uVar2 != 0) << 3 | (uVar1 != 0) << 2;
  k = 0;
  bVar13 = true;
  if ((long)local_180 < 0xff1b) {
    if ((long)local_180 < 0xff0d) {
      if (local_180 == 0xff08) {
        k = 0x9f;
      }
      else {
        if (local_180 != 0xff09) goto switchD_00125ab1_caseD_ff58;
        k = 0x9d;
      }
    }
    else if (local_180 == 0xff0d) {
      k = 0x9c;
    }
    else {
      if (local_180 != 0xff13) goto switchD_00125ab1_caseD_ff58;
      k = 0x99;
    }
    goto LAB_00125db2;
  }
  switch(local_180) {
  case 0xff50:
    k = 0x94;
    goto LAB_00125db2;
  case 0xff51:
    k = 0x81;
    goto LAB_00125db2;
  case 0xff52:
    k = 0x83;
    goto LAB_00125db2;
  case 0xff53:
    k = 0x82;
    goto LAB_00125db2;
  case 0xff54:
    k = 0x80;
    goto LAB_00125db2;
  case 0xff55:
    k = 0x95;
    goto LAB_00125db2;
  case 0xff56:
    k = 0x97;
    goto LAB_00125db2;
  case 0xff57:
    k = 0x96;
    goto LAB_00125db2;
  case 0xff58:
  case 0xff59:
  case 0xff5a:
  case 0xff5b:
  case 0xff5c:
  case 0xff5d:
  case 0xff5e:
  case 0xff5f:
  case 0xff60:
  case 0xff61:
  case 0xff62:
  case 0xff64:
  case 0xff65:
  case 0xff66:
  case 0xff67:
  case 0xff68:
  case 0xff69:
  case 0xff6a:
  case 0xff6c:
  case 0xff6d:
  case 0xff6e:
  case 0xff6f:
  case 0xff70:
  case 0xff71:
  case 0xff72:
  case 0xff73:
  case 0xff74:
  case 0xff75:
  case 0xff76:
  case 0xff77:
  case 0xff78:
  case 0xff79:
  case 0xff7a:
  case 0xff7b:
  case 0xff7c:
  case 0xff7d:
  case 0xff7e:
  case 0xff7f:
  case 0xff80:
  case 0xff81:
  case 0xff82:
  case 0xff83:
  case 0xff84:
  case 0xff85:
  case 0xff86:
  case 0xff87:
  case 0xff88:
  case 0xff89:
  case 0xff8a:
  case 0xff8b:
  case 0xff8c:
  case 0xff8e:
  case 0xff8f:
  case 0xff90:
  case 0xff91:
  case 0xff92:
  case 0xff93:
  case 0xff94:
  case 0xffa0:
  case 0xffa1:
  case 0xffa2:
  case 0xffa3:
  case 0xffa4:
  case 0xffa5:
  case 0xffa6:
  case 0xffa7:
  case 0xffa8:
  case 0xffa9:
  case 0xffac:
  case 0xffba:
  case 0xffbb:
  case 0xffbc:
switchD_00125ab1_caseD_ff58:
    bVar3 = true;
    goto LAB_00125db4;
  case 0xff63:
    k = 0x98;
    goto LAB_00125db2;
  case 0xff6b:
    k = 0x9a;
    goto LAB_00125db2;
  case 0xff8d:
    k = 0x9c;
    break;
  case 0xff95:
    k = 0x94;
    break;
  case 0xff96:
    k = 0x81;
    break;
  case 0xff97:
    k = 0x83;
    break;
  case 0xff98:
    k = 0x82;
    break;
  case 0xff99:
    k = 0x80;
    break;
  case 0xff9a:
    k = 0x95;
    break;
  case 0xff9b:
    k = 0x97;
    break;
  case 0xff9c:
    k = 0x96;
    break;
  case 0xff9d:
    k = 0x9b;
    break;
  case 0xff9e:
    k = 0x98;
    break;
  case 0xff9f:
    k = 0x9e;
    break;
  case 0xffaa:
    k = 0x2a;
    break;
  case 0xffab:
    k = 0x2b;
    break;
  case 0xffad:
    k = 0x2d;
    break;
  case 0xffae:
    k = 0x2e;
    break;
  case 0xffaf:
    k = 0x2f;
    break;
  case 0xffb0:
    k = 0x30;
    break;
  case 0xffb1:
    k = 0x31;
    break;
  case 0xffb2:
    k = 0x32;
    break;
  case 0xffb3:
    k = 0x33;
    break;
  case 0xffb4:
    k = 0x34;
    break;
  case 0xffb5:
    k = 0x35;
    break;
  case 0xffb6:
    k = 0x36;
    break;
  case 0xffb7:
    k = 0x37;
    break;
  case 0xffb8:
    k = 0x38;
    break;
  case 0xffb9:
    k = 0x39;
    break;
  case 0xffbd:
    k = 0x3d;
    break;
  case 0xffbe:
    k = 0x84;
    goto LAB_00125db2;
  case 0xffbf:
    k = 0x85;
    goto LAB_00125db2;
  case 0xffc0:
    k = 0x86;
    goto LAB_00125db2;
  case 0xffc1:
    k = 0x87;
    goto LAB_00125db2;
  case 0xffc2:
    k = 0x88;
    goto LAB_00125db2;
  case 0xffc3:
    k = 0x89;
    goto LAB_00125db2;
  case 0xffc4:
    k = 0x8a;
    goto LAB_00125db2;
  case 0xffc5:
    k = 0x8b;
    goto LAB_00125db2;
  case 0xffc6:
    k = 0x8c;
    goto LAB_00125db2;
  case 0xffc7:
    k = 0x8d;
    goto LAB_00125db2;
  case 0xffc8:
    k = 0x8e;
    goto LAB_00125db2;
  case 0xffc9:
    k = 0x8f;
    goto LAB_00125db2;
  case 0xffca:
    k = 0x90;
    goto LAB_00125db2;
  case 0xffcb:
    k = 0x91;
    goto LAB_00125db2;
  case 0xffcc:
    k = 0x92;
    goto LAB_00125db2;
  default:
    if (local_180 == 0xff1b) {
      k = 0xe000;
    }
    else {
      if (local_180 != 0xffff) goto switchD_00125ab1_caseD_ff58;
      k = 0x9e;
    }
    goto LAB_00125db2;
  }
  bVar13 = false;
LAB_00125db2:
  bVar3 = false;
LAB_00125db4:
  bVar10 = bVar11 | 0x10;
  if (bVar13) {
    bVar10 = bVar11;
  }
  if (bVar3) {
    if (0xfeff < (uint)local_180 || iVar5 == 0) goto LAB_00125b5a;
    k = (keycode_t)local_b8[0];
    bVar10 = bVar10 | ((byte)(local_b8[0] - 0x20U) < 0xe1 && (local_128 & 4) != 0);
    bVar11 = bVar10 | 2;
    if ((byte)(local_b8[0] - 0x3aU) < 0x27) {
      bVar11 = bVar10;
    }
    if ((byte)(local_b8[0] - 0x21U) < 0xf) {
      bVar11 = bVar10;
    }
    if ((byte)(local_b8[0] + 0x85U) < 4) {
      bVar11 = bVar10;
    }
    if ((local_128 & 1) == 0) {
      bVar11 = bVar10;
    }
  }
  else {
    bVar10 = bVar10 | (byte)((local_128 & 4) >> 2);
    bVar11 = bVar10 | 2;
    if ((local_128 & 1) == 0) {
      bVar11 = bVar10;
    }
  }
  Term_keypress(k,bVar11);
LAB_00125b5a:
  Term_activate(t);
  Infowin = (infowin *)t[1].data;
  return 0;
}

Assistant:

static errr CheckEvent(bool wait)
{
	term_data *old_td = (term_data*)(Term->data);

	XEvent xev_body, *xev = &xev_body;

	term_data *td = NULL;
	infowin *iwin = NULL;

	int i;
	int window = 0;

	/* Do not wait unless requested */
	if (!wait && !XPending(Metadpy->dpy)) return (1);

	/* Wait in 0.02s increments while updating animations every 0.2s */
	i = 0;
	while (!XPending(Metadpy->dpy)) {
		if (i == 0) idle_update();
		usleep(20000);
		i = (i + 1) % 10;
	}

	/* Load the Event */
	XNextEvent(Metadpy->dpy, xev);


	/* Notice new keymaps */
	if (xev->type == MappingNotify) {
		XRefreshKeyboardMapping(&xev->xmapping);
		return 0;
	}


	/* Scan the windows */
	for (i = 0; i < MAX_TERM_DATA; i++) {
		if (xev->xany.window == data[i].win->win) {
			td = &data[i];
			iwin = td->win;
			window = i;
			break;
		}
	}

	/* Unknown window */
	if (!td || !iwin) return (0);

	/* Hack -- activate the Term */
	Term_activate(&td->t);

	/* Hack -- activate the window */
	Infowin_set(iwin);

	/* Switch on the Type */
	switch (xev->type)
	{
		case ButtonPress:
		{
			bool press = (xev->type == ButtonPress);

			int z = 0;

			/* Where is the mouse */
			int x = xev->xbutton.x;
			int y = xev->xbutton.y;

			/* Which button is involved */
			if (xev->xbutton.button == Button1) z = 1;
			else if (xev->xbutton.button == Button2) z = 2;
			else if (xev->xbutton.button == Button3) z = 3;
			else if (xev->xbutton.button == Button4) z = 4;
			else if (xev->xbutton.button == Button5) z = 5;
			else z = 0;

			/* Save a byte in ui-term/Term_mousepress for some reason */
			uint32_t state = ((XButtonEvent*) xev)->state;
			if(state & ShiftMask) {
				z |= (KC_MOD_SHIFT << 4);
			}
			if(state & ControlMask) {
				z |= (KC_MOD_CONTROL << 4);
			}
			if(state & Mod1Mask) {
				z |= (KC_MOD_ALT << 4);
			}

			/* The co-ordinates are only used in Angband format. */
			pixel_to_square(&x, &y, x, y);
			if (press) Term_mousepress(x, y, z);

			break;
		}

		case KeyPress:
		{
			/* Hack -- use "old" term */
			Term_activate(&old_td->t);

			/* Process the key */
			react_keypress(&(xev->xkey));

			break;
		}

		case Expose:
		{
			int x1, x2, y1, y2;

			x1 = (xev->xexpose.x - Infowin->ox) / td->tile_wid;
			x2 = (xev->xexpose.x + xev->xexpose.width - Infowin->ox) /
				td->tile_wid;

			y1 = (xev->xexpose.y - Infowin->oy) / td->tile_hgt;
			y2 = (xev->xexpose.y + xev->xexpose.height - Infowin->oy) /
				td->tile_hgt;

			Term_redraw_section(x1, y1, x2, y2);

			break;
		}

		case MapNotify:
		{
			Infowin->mapped = 1;
			Term->mapped_flag = true;
			break;
		}

		case UnmapNotify:
		{
			Infowin->mapped = 0;
			Term->mapped_flag = false;
			break;
		}

		/* Move and/or Resize */
		case ConfigureNotify:
		{
			int cols, rows, wid, hgt, force_resize;

			int ox = Infowin->ox;
			int oy = Infowin->oy;

			/* Save the new Window Parms */
			Infowin->x = xev->xconfigure.x;
			Infowin->y = xev->xconfigure.y;
			Infowin->w = xev->xconfigure.width;
			Infowin->h = xev->xconfigure.height;

			/* Determine "proper" number of rows/cols */
			cols = ((Infowin->w - (ox + ox)) / td->tile_wid);
			rows = ((Infowin->h - (oy + oy)) / td->tile_hgt);

			/* Hack -- minimal size */
			if (cols < 1) cols = 1;
			if (rows < 1) rows = 1;

			if (window == 0) {
				/* Hack the main window must be at least 80x24 */
				force_resize = false;
				if (cols < 80) {
					cols = 80;
					force_resize = true;
				}
				if (rows < 24) {
					rows = 24;
					force_resize = true;
				}

				/* Resize the windows if any "change" is needed */
				if (force_resize) {
					/* Desired size of window */
					wid = cols * td->tile_wid + (ox + ox);
					hgt = rows * td->tile_hgt + (oy + oy);

					/* Resize window */
					Infowin_set(td->win);
					Infowin_resize(wid, hgt);
				}
			}

			/* Resize the Term (if needed) */
			(void)Term_resize(cols, rows);

			break;
		}
	}

	/* Hack -- Activate the old term */
	Term_activate(&old_td->t);

	/* Hack -- Activate the proper window */
	Infowin_set(old_td->win);

	/* Success */
	return (0);
}